

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

iterator __thiscall
pybind11::
make_iterator<(pybind11::return_value_policy)6,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,PerfectMatch&>
          (pybind11 *this,
          __normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>
          first,__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>
                last)

{
  type_info *ptVar1;
  class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,false,(pybind11::return_value_policy)6>>
  *this_00;
  object extraout_RDX;
  iterator iVar2;
  return_value_policy local_43;
  type local_42;
  type local_41;
  object local_40;
  itype local_38;
  
  local_38.it._M_current =
       (PerfectMatch *)
       &detail::
        iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,false,(pybind11::return_value_policy)6>
        ::typeinfo;
  ptVar1 = detail::get_type_info((type_index *)&local_38,false);
  if (ptVar1 == (type_info *)0x0) {
    local_40.super_handle.m_ptr._0_1_ = 1;
    class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>,___gnu_cxx::__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>,_false,_(pybind11::return_value_policy)6>_>
    ::class_<pybind11::module_local>
              ((class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>,___gnu_cxx::__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>,_false,_(pybind11::return_value_policy)6>_>
                *)&local_38,(handle)0x0,"iterator",(module_local *)&local_40);
    this_00 = (class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,false,(pybind11::return_value_policy)6>>
               *)class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,false,(pybind11::return_value_policy)6>>
                 ::
                 def<pybind11::make_iterator<(pybind11::return_value_policy)6,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,PerfectMatch&>(__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>)::_lambda(pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,false,(pybind11::return_value_policy)6>&)_1_>
                           ((class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,false,(pybind11::return_value_policy)6>>
                             *)&local_38,"__iter__",&local_41);
    local_43 = reference_internal;
    class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,false,(pybind11::return_value_policy)6>>
    ::
    def<pybind11::make_iterator<(pybind11::return_value_policy)6,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,PerfectMatch&>(__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>)::_lambda(pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,false,(pybind11::return_value_policy)6>&)_2_,pybind11::return_value_policy>
              (this_00,"__next__",&local_42,&local_43);
    object::~object((object *)&local_38);
  }
  local_38.first_or_done = true;
  local_38.it._M_current = first._M_current;
  local_38.end._M_current = last._M_current;
  local_40.super_handle =
       detail::
       type_caster_base<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>,___gnu_cxx::__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>,_false,_(pybind11::return_value_policy)6>_>
       ::cast(&local_38,move,(handle)0x0);
  iterator::iterator((iterator *)this,&local_40);
  object::~object(&local_40);
  iVar2.value.super_handle.m_ptr = extraout_RDX.super_handle.m_ptr;
  iVar2.super_object.super_handle.m_ptr = (handle)(handle)this;
  return iVar2;
}

Assistant:

iterator make_iterator(Iterator first, Sentinel last, Extra &&... extra) {
    using state = detail::iterator_state<Iterator, Sentinel, false, Policy>;

    if (!detail::get_type_info(typeid(state), false)) {
        class_<state>(handle(), "iterator", pybind11::module_local())
            .def("__iter__", [](state &s) -> state& { return s; })
            .def("__next__", [](state &s) -> ValueType {
                if (!s.first_or_done)
                    ++s.it;
                else
                    s.first_or_done = false;
                if (s.it == s.end) {
                    s.first_or_done = true;
                    throw stop_iteration();
                }
                return *s.it;
            }, std::forward<Extra>(extra)..., Policy);
    }

    return cast(state{first, last, true});
}